

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiredis.c
# Opt level: O2

void * createNilObject(redisReadTask *task)

{
  uint uVar1;
  uint *puVar2;
  redisReply *prVar3;
  
  prVar3 = createReplyObject(4);
  if ((prVar3 != (redisReply *)0x0) && (task->parent != (redisReadTask *)0x0)) {
    puVar2 = (uint *)task->parent->obj;
    uVar1 = *puVar2;
    if ((10 < uVar1) || ((0x604U >> (uVar1 & 0x1f) & 1) == 0)) {
      __assert_fail("parent->type == REDIS_REPLY_ARRAY || parent->type == REDIS_REPLY_MAP || parent->type == REDIS_REPLY_SET"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/hiredis.c"
                    ,0xef,"void *createNilObject(const redisReadTask *)");
    }
    *(redisReply **)(*(long *)(puVar2 + 0xc) + (long)task->idx * 8) = prVar3;
  }
  return prVar3;
}

Assistant:

static void *createNilObject(const redisReadTask *task) {
    redisReply *r, *parent;

    r = createReplyObject(REDIS_REPLY_NIL);
    if (r == NULL)
        return NULL;

    if (task->parent) {
        parent = task->parent->obj;
        assert(parent->type == REDIS_REPLY_ARRAY ||
               parent->type == REDIS_REPLY_MAP ||
               parent->type == REDIS_REPLY_SET);
        parent->element[task->idx] = r;
    }
    return r;
}